

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O0

Matrix3d *
Util::ECEF2ECI(double JD_UTC,MatrixXd *nut80ptr,MatrixXd *iau1980ptr,
              vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *matvecptr)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  Scalar SVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_RCX;
  Matrix3d *in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  double dVar6;
  __type _Var7;
  __type _Var8;
  __type _Var9;
  Vector3d *angles_00;
  double dVar10;
  Scalar SVar11;
  vector<int,_std::allocator<int>_> *__x;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
  *this;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> PVar12;
  Matrix3d horror;
  Matrix3d S;
  double theta_GAST;
  double Eqequinox1982;
  double theta_GMST;
  double dT;
  double MJD_UT1;
  double dUTC;
  Matrix3d W;
  double yp;
  double xp;
  Matrix3d N;
  double aPi;
  double idx;
  double D;
  double C;
  double B;
  double A;
  double an5;
  double an4;
  double an3;
  double an2;
  double an1;
  int ii;
  double deltaEsp_1980;
  double deltaPsi_1980;
  double Ohm_moon;
  double D_circle;
  double uM_moon;
  double M_cirle;
  double M_moon;
  double r;
  double epsbar1980;
  Matrix3d P;
  vector<int,_std::allocator<int>_> order;
  Vector3d angles;
  double z;
  double theta;
  double zeta;
  double z_deg;
  double theta_deg;
  double zeta_deg;
  double LOD2;
  double LOD1;
  double UT1_UTC2;
  double UT1_UTC1;
  double PMy2;
  double PMy1;
  double PMx2;
  double PMx1;
  int tidx;
  double JD_UTC_rem;
  double tsinceJ2000;
  double MJD_TT;
  double MJD_TAI;
  double MJD_UTC;
  double MJD_J2000;
  double MJD_offset;
  double J2000;
  Matrix3d *Rotm;
  undefined4 in_stack_fffffffffffff518;
  int in_stack_fffffffffffff51c;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_fffffffffffff520;
  value_type *in_stack_fffffffffffff528;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff530;
  Scalar *in_stack_fffffffffffff538;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff540;
  allocator_type *in_stack_fffffffffffff548;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_fffffffffffff550;
  iterator in_stack_fffffffffffff558;
  size_type in_stack_fffffffffffff560;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff568;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff570;
  vector<int,_std::allocator<int>_> *pvVar13;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff6a0;
  vector<int,_std::allocator<int>_> *order_00;
  Vector3d *in_stack_fffffffffffff6a8;
  Matrix3d *in_stack_fffffffffffff858;
  undefined4 local_3f4;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 *local_3e8;
  undefined8 local_3e0;
  Scalar local_3d8;
  double local_3d0;
  double local_3c8;
  double local_3c0;
  double local_3b8;
  double local_3b0;
  undefined4 local_32c;
  undefined4 local_328;
  undefined4 local_324;
  undefined4 *local_320;
  undefined8 local_318;
  Scalar local_310;
  Scalar local_308;
  undefined4 local_284;
  undefined4 local_280;
  undefined4 local_27c;
  undefined4 *local_278;
  undefined8 local_270;
  double local_268;
  Scalar local_260;
  Scalar local_258;
  Scalar local_250;
  Scalar local_248;
  Scalar local_240;
  Scalar local_238;
  Scalar local_230;
  Scalar local_228;
  Scalar local_220;
  Scalar local_218;
  int local_20c;
  double local_208;
  vector<int,_std::allocator<int>_> *local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 local_12c;
  undefined4 *local_128;
  undefined8 local_120;
  double local_100;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  int local_6c;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  undefined8 local_38;
  undefined8 local_30;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *local_28;
  
  local_30 = 0x4142b42c80000000;
  local_38 = 0x41424f8040000000;
  local_40 = 51544.5;
  dVar5 = in_XMM0_Qa - 2400000.5;
  local_50 = dVar5 + 0.00042824074074074075;
  local_58 = local_50 + 0.00037249999999999995;
  local_60 = (local_58 - 51544.5) / 36525.0;
  local_48 = dVar5;
  local_28 = in_RCX;
  local_68 = floor(dVar5);
  dVar6 = local_48;
  local_68 = dVar5 - local_68;
  pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                     (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                      (Index)in_stack_fffffffffffff530);
  dVar6 = floor(dVar6 - *pSVar2);
  local_6c = (int)dVar6;
  pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                     (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                      (Index)in_stack_fffffffffffff530);
  local_78 = *pSVar2;
  pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                     (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                      (Index)in_stack_fffffffffffff530);
  local_80 = *pSVar2;
  pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                     (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                      (Index)in_stack_fffffffffffff530);
  local_88 = *pSVar2;
  pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                     (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                      (Index)in_stack_fffffffffffff530);
  local_90 = *pSVar2;
  pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                     (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                      (Index)in_stack_fffffffffffff530);
  local_98 = *pSVar2;
  pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                     (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                      (Index)in_stack_fffffffffffff530);
  local_a0 = *pSVar2;
  pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                     (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                      (Index)in_stack_fffffffffffff530);
  local_a8 = *pSVar2;
  pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                     (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                      (Index)in_stack_fffffffffffff530);
  dVar6 = local_60;
  local_b0 = *pSVar2;
  _Var7 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  _Var8 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  dVar5 = local_60;
  local_b8 = _Var8 * 0.017998 + dVar6 * 2306.2181 + _Var7 * 0.30188;
  _Var7 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  _Var8 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  dVar6 = local_60;
  local_c0 = _Var8 * -0.041833 + dVar5 * 2004.3109 + _Var7 * -0.42665;
  _Var7 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  _Var8 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  local_c8 = _Var8 * 0.018203 + dVar6 * 2306.2181 + _Var7 * 1.09468;
  local_d0 = (local_b8 * 3.141592653589793) / 648000.0;
  local_d8 = (local_c0 * 3.141592653589793) / 648000.0;
  local_e0 = (local_c8 * 3.141592653589793) / 648000.0;
  local_100 = -local_d8;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffff550,(Scalar *)in_stack_fffffffffffff548,
             (Scalar *)in_stack_fffffffffffff540,in_stack_fffffffffffff538);
  local_134 = 3;
  local_130 = 2;
  local_12c = 3;
  local_128 = &local_134;
  local_120 = 3;
  std::allocator<int>::allocator((allocator<int> *)0x116eef);
  __l_02._M_len = in_stack_fffffffffffff560;
  __l_02._M_array = in_stack_fffffffffffff558;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff550,__l_02,
             in_stack_fffffffffffff548);
  std::allocator<int>::~allocator((allocator<int> *)0x116f23);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff520,
             (Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  Angle2RotM(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffff530);
  dVar6 = local_60 * -46.815;
  _Var7 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  _Var8 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  local_1c8 = ((_Var8 * 0.001813 + _Var7 * -0.00059 + dVar6 + 84381.448) * 3.141592653589793) /
              648000.0;
  local_1d0 = 360.0;
  dVar6 = local_60 * 477198.8673981;
  _Var7 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  _Var8 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  _Var9 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  local_1d8 = _Var8 * 1.78 * _Var9 + _Var7 * 0.0086972 + dVar6 + 134.96298139;
  dVar6 = (local_1d0 * 99.0 + 359.05034) * local_60;
  _Var7 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  _Var8 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  _Var9 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  local_1e0 = (_Var7 * -0.0001603 + dVar6 + 357.52772333) - _Var8 * 3.3 * _Var9;
  dVar6 = (local_1d0 * 1342.0 + 82.0175381) * local_60;
  _Var7 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  _Var8 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  _Var9 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  local_1e8 = _Var8 * 3.1 * _Var9 + _Var7 * -0.0036825 + dVar6 + 93.27191028;
  dVar6 = (local_1d0 * 1236.0 + 307.11148) * local_60;
  _Var7 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  _Var8 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  _Var9 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  local_1f0 = _Var8 * 5.3 * _Var9 + _Var7 * -0.0019142 + dVar6 + 297.85036306;
  order_00 = (vector<int,_std::allocator<int>_> *)
             (125.04452222 - (local_1d0 * 5.0 + 134.1362608) * local_60);
  angles_00 = (Vector3d *)
              std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  dVar6 = (double)angles_00 * 0.0020708 + (double)order_00;
  _Var7 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  _Var8 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  local_1d8 = (local_1d8 * 3.141592653589793) / 180.0;
  local_1e0 = (local_1e0 * 3.141592653589793) / 180.0;
  local_1e8 = (local_1e8 * 3.141592653589793) / 180.0;
  local_1f0 = (local_1f0 * 3.141592653589793) / 180.0;
  local_1f8 = ((_Var7 * 2.2 * _Var8 + dVar6) * 3.141592653589793) / 180.0;
  local_200 = (vector<int,_std::allocator<int>_> *)0x0;
  local_208 = 0.0;
  for (local_20c = 0; pvVar13 = local_200, local_20c < 0x6a; local_20c = local_20c + 1) {
    pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                       (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                        (Index)in_stack_fffffffffffff530);
    local_218 = *pSVar2;
    pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                       (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                        (Index)in_stack_fffffffffffff530);
    local_220 = *pSVar2;
    pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                       (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                        (Index)in_stack_fffffffffffff530);
    local_228 = *pSVar2;
    pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                       (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                        (Index)in_stack_fffffffffffff530);
    local_230 = *pSVar2;
    pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                       (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                        (Index)in_stack_fffffffffffff530);
    local_238 = *pSVar2;
    pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                       (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                        (Index)in_stack_fffffffffffff530);
    local_240 = *pSVar2;
    pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                       (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                        (Index)in_stack_fffffffffffff530);
    local_248 = *pSVar2;
    pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                       (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                        (Index)in_stack_fffffffffffff530);
    local_250 = *pSVar2;
    pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                       (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                        (Index)in_stack_fffffffffffff530);
    local_258 = *pSVar2;
    pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                       (in_stack_fffffffffffff540,(Index)in_stack_fffffffffffff538,
                        (Index)in_stack_fffffffffffff530);
    pvVar13 = local_200;
    local_260 = *pSVar2;
    local_268 = local_238 * local_1f8 +
                local_230 * local_1f0 +
                local_228 * local_1e8 + local_218 * local_1d8 + local_220 * local_1e0;
    dVar5 = local_248 * local_60 + local_240;
    dVar10 = sin(local_268);
    dVar6 = local_208;
    local_200 = (vector<int,_std::allocator<int>_> *)(dVar5 * dVar10 + (double)pvVar13);
    dVar5 = local_258 * local_60 + local_250;
    dVar10 = cos(local_268);
    local_208 = dVar5 * dVar10 + dVar6;
  }
  _Var7 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  dVar6 = local_208;
  local_200 = (vector<int,_std::allocator<int>_> *)
              (((double)pvVar13 * _Var7 * 3.141592653589793) / 648000.0);
  _Var7 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  local_208 = (dVar6 * _Var7 * 3.141592653589793) / 648000.0;
  local_284 = 1;
  local_280 = 3;
  local_27c = 1;
  local_278 = &local_284;
  local_270 = 3;
  __l._M_len = (size_type)in_stack_fffffffffffff540;
  __l._M_array = (iterator)in_stack_fffffffffffff538;
  std::vector<int,_std::allocator<int>_>::operator=(in_stack_fffffffffffff530,__l);
  dVar6 = local_1c8 + local_208;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff520,
                      CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  pvVar13 = local_200;
  *pSVar3 = dVar6;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff520,
                      CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  *pSVar3 = (Scalar)pvVar13;
  SVar11 = -local_1c8;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff520,
                      CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  *pSVar3 = SVar11;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff520,
             (Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  Angle2RotM(angles_00,order_00);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffff530);
  local_308 = ((local_68 * (local_80 - local_78) + local_78) * 3.141592653589793) / 648000.0;
  local_310 = ((local_68 * (local_90 - local_88) + local_88) * 3.141592653589793) / 648000.0;
  local_32c = 2;
  local_328 = 1;
  local_324 = 3;
  local_320 = &local_32c;
  local_318 = 3;
  __l_00._M_len = (size_type)in_stack_fffffffffffff540;
  __l_00._M_array = (iterator)in_stack_fffffffffffff538;
  std::vector<int,_std::allocator<int>_>::operator=(in_stack_fffffffffffff530,__l_00);
  SVar1 = local_308;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff520,
                      CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  SVar11 = local_310;
  *pSVar3 = SVar1;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff520,
                      CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  *pSVar3 = SVar11;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff520,
                      CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  *pSVar3 = 0.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff520,
             (Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  Angle2RotM(angles_00,order_00);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffff530);
  local_3b0 = local_68 * (local_a0 - local_98) + local_98;
  local_3b8 = local_48 + local_3b0 / 86400.0;
  dVar6 = local_3b8 - local_40;
  local_3c0 = dVar6;
  _Var7 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  _Var8 = std::pow<double,int>((double)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
  local_3c8 = dVar6 * (dVar6 * (_Var7 * 5.0752099941135915 + _Var8 * -9.253097568194336 * local_3c0)
                      + 6.300388098984894) + 4.894961212823059;
  pvVar13 = local_200;
  __x = (vector<int,_std::allocator<int>_> *)cos(local_1c8);
  dVar6 = sin(local_1f8);
  dVar5 = sin(local_1f8 + local_1f8);
  local_3d0 = (double)pvVar13 * (double)__x +
              ((dVar6 * 0.00264 + dVar5 * 6.3e-05) * 3.141592653589793) / 648000.0;
  local_3d8 = local_3c8 + local_3d0;
  local_3f4 = 3;
  local_3f0 = 1;
  local_3ec = 3;
  local_3e8 = &local_3f4;
  local_3e0 = 3;
  __l_01._M_len = (size_type)in_stack_fffffffffffff540;
  __l_01._M_array = (iterator)in_stack_fffffffffffff538;
  std::vector<int,_std::allocator<int>_>::operator=(in_stack_fffffffffffff530,__l_01);
  SVar11 = -local_3d8;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff520,
                      CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  *pSVar3 = SVar11;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff520,
                      CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  *pSVar3 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff520,
                      CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  *pSVar3 = 0.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff520,
             (Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  std::vector<int,_std::allocator<int>_>::vector(pvVar13,__x);
  Angle2RotM(angles_00,order_00);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffff530);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff520,
             (Matrix<double,_3,_3,_0,_3,_3> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  OrthoNormMat(in_stack_fffffffffffff858);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff520,
             (Matrix<double,_3,_3,_0,_3,_3> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff520,
             (Matrix<double,_3,_3,_0,_3,_3> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  OrthoNormMat(in_stack_fffffffffffff858);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff520,
             (Matrix<double,_3,_3,_0,_3,_3> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff520,
             (Matrix<double,_3,_3,_0,_3,_3> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  OrthoNormMat(in_stack_fffffffffffff858);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff520,
             (Matrix<double,_3,_3,_0,_3,_3> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff520,
             (Matrix<double,_3,_3,_0,_3,_3> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  OrthoNormMat(in_stack_fffffffffffff858);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff520,
             (Matrix<double,_3,_3,_0,_3,_3> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::operator[](local_28,0);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff520,
             (Matrix<double,_3,_3,_0,_3,_3> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::operator[](local_28,1);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff520,
             (Matrix<double,_3,_3,_0,_3,_3> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::operator[](local_28,2);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff520,
             (Matrix<double,_3,_3,_0,_3,_3> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::operator[](local_28,3);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff520,
             (Matrix<double,_3,_3,_0,_3,_3> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero
            ((Index)in_stack_fffffffffffff528,(Index)in_stack_fffffffffffff520);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff520,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  this = (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
          *)(local_68 * (local_b0 - local_a8) + local_a8);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_fffffffffffff520,
                      CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),0x118435);
  *pSVar4 = (Scalar)this;
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)this,in_stack_fffffffffffff528);
  PVar12 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff520
                      ,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>::
  operator*(this,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)PVar12.m_lhs);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)PVar12.m_lhs);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            (PVar12.m_rhs,
             (EigenBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            (PVar12.m_rhs,
             (Matrix<double,_3,_3,_0,_3,_3> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  OrthoNormMat(in_stack_fffffffffffff858);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            (PVar12.m_rhs,
             (Matrix<double,_3,_3,_0,_3,_3> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  return in_RDI;
}

Assistant:

Eigen::Matrix3d ECEF2ECI(double JD_UTC, Eigen::MatrixXd* nut80ptr, Eigen::MatrixXd* iau1980ptr, std::vector<Eigen::Matrix3d>* matvecptr){

		//********* deal with time ******************

		//J2000 time
		double J2000 = 2451545.0;

		//offset to get mean julian dates
		double MJD_offset = 2400000.5;

		//mean julian date, J2000
		double MJD_J2000 = J2000 - MJD_offset;

		//current mean JD
		double MJD_UTC = JD_UTC - MJD_offset;

		double MJD_TAI = MJD_UTC + 37.0/(3600.0*24.0);
		double MJD_TT = MJD_TAI + 32.184/(3600.0*24.0);

		// find the change in time since J2000.0 (T_TT)
		double tsinceJ2000 = (MJD_TT - MJD_J2000)/36525.0;

		//find the remainder in the current JD
		double JD_UTC_rem = MJD_UTC - floor(MJD_UTC);

		// std::cout << "MJD_J2000: " << MJD_J2000 << "\n";
		// std::cout << "MJD_UTC: " << MJD_UTC << "\n";
		// std::cout << "MJD_TAI: " << MJD_TAI << "\n";
		// std::cout << "MJD_TT: " << MJD_TT << "\n";
		// std::cout << "JD_UTC_rem: " << JD_UTC_rem << "\n";

		//we will manually find values from iau1980.txt because lazy
		// std::cout << "You need to manually find this in iau1980.txt \n";
		// std::cout << "floor(MJD_UTC): " << floor(MJD_UTC) << "\n";
		// exit(0);

		//manual search found this:
		// 1712 1 58088.00 I  0.124136 0.000022  0.236728 0.000035  I 0.2485001 0.0000084  1.5396 0.0061  I  -104.226    0.322    -8.561    0.160  0.124126  0.236687  0.2485227  -104.524    -8.685  
		// 1712 2 58089.00 I  0.121708 0.000026  0.236266 0.000028  I 0.2469699 0.0000084  1.4837 0.0058  I  -104.143    0.322    -8.430    0.160  0.121669  0.236396  0.2469833  -105.014    -8.516
		// double PMx1 = 0.124126;
		// double PMx2 = 0.121669;
		// double PMy1 = 0.236687;
		// double PMy2 = 0.236396;
		// double UT1_UTC1 = 0.24852270;
		// double UT1_UTC2 = 0.24698330;

		//get initial index of desired time
		int tidx = floor(MJD_UTC - iau1980ptr->coeff(0,0));

		// std::cout << "located at index: " << tidx << "\n";

		//extract values
		double PMx1 = iau1980ptr->coeff(tidx,1);
		double PMx2 = iau1980ptr->coeff(tidx+1,1);
		double PMy1 = iau1980ptr->coeff(tidx,2);
		double PMy2 = iau1980ptr->coeff(tidx+1,2);
		double UT1_UTC1 = iau1980ptr->coeff(tidx,3);
		double UT1_UTC2 = iau1980ptr->coeff(tidx+1,3);
		double LOD1 = iau1980ptr->coeff(tidx,4);
		double LOD2 = iau1980ptr->coeff(tidx+1,4);

		//******** find rotation from precession ******************

		//now, find the three angles in degrees
		double zeta_deg = 2306.2181*tsinceJ2000 + 0.30188*pow(tsinceJ2000,2) + 0.017998*pow(tsinceJ2000,3); 
		double theta_deg = 2004.3109*tsinceJ2000 - 0.42665*pow(tsinceJ2000,2) - 0.041833*pow(tsinceJ2000,3); 
		double z_deg = 2306.2181*tsinceJ2000 + 1.09468*pow(tsinceJ2000,2) + 0.018203*pow(tsinceJ2000,3);

		//convert angles to radians
		double zeta = zeta_deg*M_PI/(3600.0*180.0);
		double theta = theta_deg*M_PI/(3600.0*180.0);
		double z = z_deg*M_PI/(3600.0*180.0);

		// std::cout << "tsinceJ2000: " << tsinceJ2000 << "\n";
		// std::cout << "zeta: " << zeta << "\n";
		// std::cout << "theta: " << theta << "\n";
		// std::cout << "z: " << z << "\n";

		//create matrix
		Eigen::Vector3d angles(z,-theta,zeta);
		std::vector<int> order = {3,2,3};
		Eigen::Matrix3d P = Angle2RotM(angles, order);

		//******** find rotation from nutation ******************

		// load the parameters
		// Eigen::MatrixXd nut80 = LoadDatFile("../data/nut80.csv", 106, 10);

		//find epsbar1980
		double epsbar1980 = (84381.448 - 46.8150*tsinceJ2000 - 0.00059*pow(tsinceJ2000,2) + 0.001813*pow(tsinceJ2000,3))*M_PI/(3600.0*180.0);

		//find values from 3-82 (corrected according to errata)
		double r = 360.0;
		double M_moon = 134.96298139 + (1325.0*r + 198.8673981)*tsinceJ2000 + 0.0086972*pow(tsinceJ2000,2) + 1.78*pow(10.0,-5)*pow(tsinceJ2000,3);
		double M_cirle = 357.52772333 + (99.0*r + 359.0503400)*tsinceJ2000 - 0.0001603*pow(tsinceJ2000,2) - 3.3*pow(10.0,-6)*pow(tsinceJ2000,3);
		double uM_moon =  93.27191028 + (1342.0*r + 82.0175381)*tsinceJ2000 - 0.0036825*pow(tsinceJ2000,2) + 3.1*pow(10.0,-6)*pow(tsinceJ2000,3);
		double D_circle = 297.85036306 + (1236.0*r + 307.1114800)*tsinceJ2000 - 0.0019142*pow(tsinceJ2000,2) + 5.3*pow(10.0,-6)*pow(tsinceJ2000,3);
		double Ohm_moon = 125.04452222 - (5.0*r + 134.1362608)*tsinceJ2000 +  0.0020708*pow(tsinceJ2000,2) + 2.2*pow(10.0,-6)*pow(tsinceJ2000,3);

		//convert to radians
		M_moon = M_moon*M_PI/180.0;
		M_cirle = M_cirle*M_PI/180.0;
		uM_moon = uM_moon*M_PI/180.0;
		D_circle = D_circle*M_PI/180.0;
		Ohm_moon = Ohm_moon*M_PI/180.0;

		// std::cout << "M_moon: " << M_moon << "\n";
		// std::cout << "M_cirle: " << M_cirle << "\n";
		// std::cout << "uM_moon: " << uM_moon << "\n";
		// std::cout << "D_circle: " << D_circle << "\n";
		// std::cout << "Ohm_moon: " << Ohm_moon << "\n";

		// exit(0);

		//sum
		double deltaPsi_1980 = 0.0;
		double deltaEsp_1980 = 0.0;
		for (int ii = 0; ii < 106; ++ii) {

			//extract locals
			double an1 = nut80ptr->coeff(ii,0);
			double an2 = nut80ptr->coeff(ii,1);
			double an3 = nut80ptr->coeff(ii,2);
			double an4 = nut80ptr->coeff(ii,3);
			double an5 = nut80ptr->coeff(ii,4);
			double A = nut80ptr->coeff(ii,5);
			double B = nut80ptr->coeff(ii,6);
			double C = nut80ptr->coeff(ii,7);
			double D = nut80ptr->coeff(ii,8);
			double idx = nut80ptr->coeff(ii,9);

			//aPi
			double aPi = an1*M_moon + an2*M_cirle + an3*uM_moon + an4*D_circle + an5*Ohm_moon;

			//sums
			deltaPsi_1980 = deltaPsi_1980 + (A + B*tsinceJ2000)*sin(aPi);
			deltaEsp_1980 = deltaEsp_1980 + (C + D*tsinceJ2000)*cos(aPi);
		}

		//convert sums to radians
		deltaPsi_1980 = deltaPsi_1980*pow(10.0,-4)*M_PI/(3600.0*180.0);
		deltaEsp_1980 = deltaEsp_1980*pow(10.0,-4)*M_PI/(3600.0*180.0);

		// std::cout << "deltaPsi_1980: " << deltaPsi_1980 << "\n";
		// std::cout << "deltaEsp_1980: " << deltaEsp_1980 << "\n";

		//rotation
		order = {1,3,1};
		angles[0] = epsbar1980 + deltaEsp_1980;
		angles[1] = deltaPsi_1980;
		angles[2] = -epsbar1980;
		Eigen::Matrix3d N = Angle2RotM(angles,order);

		// std::cout << "angles: " << angles << "\n";

		//******** find rotation from Polar Motion ******************

		//interpolate these two values based on iau1980.txt
		double xp = PMx1 + JD_UTC_rem*(PMx2 - PMx1);
		double yp = PMy1 + JD_UTC_rem*(PMy2 - PMy1);

		//convert to radians
		xp = xp*M_PI/(3600.0*180.0);
		yp = yp*M_PI/(3600.0*180.0);

		//rotation
		order = {2,1,3};
		angles[0] = xp;
		angles[1] = yp;
		angles[2] = 0.0;
		Eigen::Matrix3d W = Angle2RotM(angles,order);

		//******** find rotation from Earth Rotation ******************

		//interpolate change in UTC
		double dUTC = UT1_UTC1 + JD_UTC_rem*(UT1_UTC2 - UT1_UTC1);

		//correct modified julian date
		double MJD_UT1 = MJD_UTC + dUTC/(24.0*3600.0);

		//change in time
		double dT = MJD_UT1 - MJD_J2000;

		//Greenwich mean sidereal time (from tapley shuctz born)
		double theta_GMST = 4.894961212823058751375704430 + dT*(6.300388098984893552276513720 + dT*(5.075209994113591478053805523*pow(10.0,-15) - 9.253097568194335640067190688*pow(10.0,-24)*dT));
		// double theta_GMST2 = 4.894961212823058751375704430 + (6.3003880989848935522776513720 + (5.07520999411359147805523e-15 - 9.253097568194335640067190688e-24*dT)*dT)*dT;

		// std::cout << "one: " << theta_GMST << "\n two: " << theta_GMST2;
		
		//now we get some other crazy value
		double Eqequinox1982 = deltaPsi_1980*cos(epsbar1980) + (0.00264*sin(Ohm_moon) + 0.000063*sin(2*Ohm_moon))*M_PI/(3600.0*180.0);

		//find theta
		double theta_GAST = theta_GMST + Eqequinox1982;

		//rotation
		order = {3,1,3};
		angles[0] = -theta_GAST;
		angles[1] = 0.0;
		angles[2] = 0.0;
		Eigen::Matrix3d S = Angle2RotM(angles,order);

		// std::cout << "JD_UTC_rem: " << JD_UTC_rem << "\n";
		// std::cout << "dUTC: " << dUTC << "\n";
		// std::cout << "UT1_UTC1: " << UT1_UTC1 << "\n";
		// std::cout << "UT1_UTC2: " << UT1_UTC2 << "\n";

		//enforce orthonormalization
		P = OrthoNormMat(P);
		N = OrthoNormMat(N);
		S = OrthoNormMat(S);
		W = OrthoNormMat(W);

		// //write out all the matricies
		// std::cout << "P:\n" << P << "\n";
		// std::cout << "N:\n" << N << "\n";
		// std::cout << "S:\n" << S << "\n";
		// std::cout << "W:\n" << W << "\n";

		//write each matrix to the vector
		(*matvecptr)[0] = P;
		(*matvecptr)[1] = N;
		(*matvecptr)[2] = S;
		(*matvecptr)[3] = W;

		//do something horrific and insert the LOD value into a new element of the matvecptr
		Eigen::Matrix3d horror = Eigen::Matrix3d::Zero(3,3);
		horror(0,0) = LOD1 + JD_UTC_rem*(LOD2 - LOD1);
		matvecptr->push_back(horror);

		//Matrix
		Eigen::Matrix3d Rotm = P*N*S*W;
		Rotm = OrthoNormMat(Rotm);

		//output
		return Rotm;

	}